

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest5::iterate(FunctionalTest5 *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  uint uVar4;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  ulong uVar5;
  socklen_t __len;
  sockaddr *__addr;
  socklen_t __fd;
  undefined1 local_e4 [8];
  vec4<unsigned_int> fourth_routine_result;
  vec4<float> third_routine_result;
  vec4<float> second_routine_result;
  vec4<float> first_routine_result;
  GLuint i_1;
  GLuint i;
  GLuint routine;
  GLuint uniform;
  GLuint type;
  vertexArray vao;
  buffer transform_feedback_buffer;
  program program;
  undefined1 local_40 [5];
  bool result;
  FunctionalTest5 *local_10;
  FunctionalTest5 *this_local;
  
  local_10 = this;
  if (iterate()::input_data == '\0') {
    iVar2 = __cxa_guard_acquire(&iterate()::input_data);
    if (iVar2 != 0) {
      Utils::vec4<float>::vec4(iterate::input_data,1.0,4.0,9.0,16.0);
      Utils::vec4<float>::vec4(iterate::input_data + 1,16.0,9.0,4.0,1.0);
      Utils::vec4<float>::vec4(iterate::input_data + 2,0.25,0.5,0.75,1.0);
      __cxa_guard_release(&iterate()::input_data);
    }
  }
  if (iterate()::expected_result_from_first_routine == '\0') {
    iVar2 = __cxa_guard_acquire(&iterate()::expected_result_from_first_routine);
    if (iVar2 != 0) {
      Utils::vec4<float>::vec4(iterate::expected_result_from_first_routine,17.0,13.0,13.0,17.0);
      Utils::vec4<float>::vec4(iterate::expected_result_from_first_routine + 1,-15.0,-5.0,5.0,15.0);
      __cxa_guard_release(&iterate()::expected_result_from_first_routine);
    }
  }
  if (iterate()::expected_result_from_second_routine == '\0') {
    iVar2 = __cxa_guard_acquire(&iterate()::expected_result_from_second_routine);
    if (iVar2 != 0) {
      Utils::vec4<float>::vec4(iterate::expected_result_from_second_routine,1.0,16.0,81.0,256.0);
      Utils::vec4<float>::vec4(iterate::expected_result_from_second_routine + 1,1.0,2.0,3.0,4.0);
      __cxa_guard_release(&iterate()::expected_result_from_second_routine);
    }
  }
  if (iterate()::expected_result_from_third_routine == '\0') {
    iVar2 = __cxa_guard_acquire(&iterate()::expected_result_from_third_routine);
    if (iVar2 != 0) {
      Utils::vec4<float>::vec4(iterate::expected_result_from_third_routine,16.25,36.5,36.75,17.0);
      Utils::vec4<float>::vec4(iterate::expected_result_from_third_routine + 1,12.25,6.5,7.75,16.0);
      __cxa_guard_release(&iterate()::expected_result_from_third_routine);
    }
  }
  if (iterate()::expected_result_from_fourth_routine == '\0') {
    iVar2 = __cxa_guard_acquire(&iterate()::expected_result_from_fourth_routine);
    if (iVar2 != 0) {
      Utils::vec4<unsigned_int>::vec4(iterate::expected_result_from_fourth_routine,0,0,0,0);
      Utils::vec4<unsigned_int>::vec4(iterate::expected_result_from_fourth_routine + 1,0,0,1,1);
      __cxa_guard_release(&iterate()::expected_result_from_fourth_routine);
    }
  }
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    program.m_context._6_1_ = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_40,"GL_ARB_shader_subroutine is not supported.",
               (allocator<char> *)((long)&program.m_context + 7));
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_40);
    program.m_context._6_1_ = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  program.m_context._5_1_ = 1;
  Utils::program::program
            ((program *)&transform_feedback_buffer.m_context,(this->super_TestCase).m_context);
  Utils::buffer::buffer((buffer *)&vao.m_context,(this->super_TestCase).m_context);
  Utils::vertexArray::vertexArray((vertexArray *)&uniform,(this->super_TestCase).m_context);
  __len = 0;
  __fd = __len;
  Utils::program::build
            ((program *)&transform_feedback_buffer.m_context,(GLchar *)0x0,(GLchar *)0x0,
             (GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,iterate::vertex_shader_code,
             iterate::varying_names,4,false);
  Utils::program::use((program *)&transform_feedback_buffer.m_context);
  Utils::vertexArray::generate((vertexArray *)&uniform);
  Utils::vertexArray::bind((vertexArray *)&uniform,__fd,__addr,__len);
  Utils::buffer::generate((buffer *)&vao.m_context);
  Utils::buffer::update((buffer *)&vao.m_context,0x8c8e,0x40,(GLvoid *)0x0,0x88ea);
  Utils::buffer::bindRange((buffer *)&vao.m_context,0x8c8e,0,0,0x40);
  for (routine = 0; routine < 4; routine = routine + 1) {
    bVar1 = false;
    while (!bVar1) {
      GVar3 = Utils::program::getSubroutineUniformLocation
                        ((program *)&transform_feedback_buffer.m_context,
                         iterate::subroutine_uniform_names[routine][0],0x8b31);
      this->m_subroutine_uniform_locations[routine][0] = GVar3;
      bVar1 = true;
    }
    for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
      GVar3 = Utils::program::getSubroutineIndex
                        ((program *)&transform_feedback_buffer.m_context,
                         iterate::subroutine_names[routine][i_1],0x8b31);
      this->m_subroutine_indices[routine][i_1] = GVar3;
    }
  }
  for (first_routine_result.m_w = 0.0; (uint)first_routine_result.m_w < 3;
      first_routine_result.m_w = (float)((int)first_routine_result.m_w + 1)) {
    GVar3 = Utils::program::getUniformLocation
                      ((program *)&transform_feedback_buffer.m_context,
                       iterate::uniform_names[(uint)first_routine_result.m_w]);
    this->m_uniform_locations[(uint)first_routine_result.m_w] = GVar3;
  }
  for (first_routine_result.m_z = 0.0; (uint)first_routine_result.m_z < 0x10;
      first_routine_result.m_z = (float)((int)first_routine_result.m_z + 1)) {
    Utils::vec4<float>::vec4((vec4<float> *)&second_routine_result.m_z);
    Utils::vec4<float>::vec4((vec4<float> *)&third_routine_result.m_z);
    Utils::vec4<float>::vec4((vec4<float> *)&fourth_routine_result.m_z);
    Utils::vec4<unsigned_int>::vec4((vec4<unsigned_int> *)local_e4);
    testDraw(this,iterate::subroutine_combinations[(uint)first_routine_result.m_z],
             iterate::input_data,(vec4<float> *)&second_routine_result.m_z,
             (vec4<float> *)&third_routine_result.m_z,(vec4<float> *)&fourth_routine_result.m_z,
             (vec4<unsigned_int> *)local_e4);
    uVar4 = verify(this,(EVP_PKEY_CTX *)&second_routine_result.m_z,
                   (uchar *)&third_routine_result.m_z,(size_t)&fourth_routine_result.m_z,local_e4,
                   (size_t)(iterate::expected_result_from_first_routine +
                           iterate::subroutine_combinations[(uint)first_routine_result.m_z][0]));
    if ((uVar4 & 1) == 0) {
      uVar5 = (ulong)(uint)first_routine_result.m_z;
      logError(this,iterate::subroutine_names,iterate::subroutine_combinations[uVar5],
               iterate::input_data,(vec4<float> *)&second_routine_result.m_z,
               (vec4<float> *)&third_routine_result.m_z,(vec4<float> *)&fourth_routine_result.m_z,
               (vec4<unsigned_int> *)local_e4,
               iterate::expected_result_from_first_routine +
               iterate::subroutine_combinations[uVar5][0],
               iterate::expected_result_from_second_routine +
               iterate::subroutine_combinations[uVar5][1],
               iterate::expected_result_from_third_routine +
               iterate::subroutine_combinations[uVar5][2],
               iterate::expected_result_from_fourth_routine +
               iterate::subroutine_combinations[uVar5][3]);
      program.m_context._5_1_ = 0;
    }
  }
  if ((program.m_context._5_1_ & 1) == 1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  Utils::vertexArray::~vertexArray((vertexArray *)&uniform);
  Utils::buffer::~buffer((buffer *)&vao.m_context);
  Utils::program::~program((program *)&transform_feedback_buffer.m_context);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest5::iterate()
{
	static const GLchar* vertex_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"// Subroutine types\n"
		"subroutine vec4  routine_type_1(in vec4 left, in vec4 right);\n"
		"subroutine vec4  routine_type_2(in vec4 iparam);\n"
		"subroutine vec4  routine_type_3(in vec4 a,    in vec4 b,    in vec4 c);\n"
		"subroutine bvec4 routine_type_4(in vec4 left, in vec4 right);\n"
		"\n"
		"// Subroutine definitions\n"
		"// 1st type\n"
		"subroutine(routine_type_1) vec4 add(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left + right;\n"
		"}\n"
		"\n"
		"subroutine(routine_type_1) vec4 subtract(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return left - right;\n"
		"}\n"
		"\n"
		"// 2nd type\n"
		"subroutine(routine_type_2) vec4 square(in vec4 iparam)\n"
		"{\n"
		"    return iparam * iparam;\n"
		"}\n"
		"\n"
		"subroutine(routine_type_2) vec4 square_root(in vec4 iparam)\n"
		"{\n"
		"    return sqrt(iparam);\n"
		"}\n"
		"\n"
		"// 3rd type\n"
		"subroutine(routine_type_3) vec4 do_fma(in vec4 a, in vec4 b, in vec4 c)\n"
		"{\n"
		"    return fma(a, b, c);\n"
		"}\n"
		"\n"
		"subroutine(routine_type_3) vec4 blend(in vec4 a, in vec4 b, in vec4 c)\n"
		"{\n"
		"    return c * a + (vec4(1) - c) * b;\n"
		"}\n"
		"\n"
		"// 4th type\n"
		"subroutine(routine_type_4) bvec4 are_equal(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return equal(left, right);\n"
		"}\n"
		"\n"
		"subroutine(routine_type_4) bvec4 are_greater(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return greaterThan(left, right);\n"
		"}\n"
		"\n"
		"// Sub routine uniforms\n"
		"subroutine uniform routine_type_1 first_routine;\n"
		"subroutine uniform routine_type_2 second_routine;\n"
		"subroutine uniform routine_type_3 third_routine;\n"
		"subroutine uniform routine_type_4 fourth_routine;\n"
		"\n"
		"// Input data\n"
		"uniform vec4 first_input;\n"
		"uniform vec4 second_input;\n"
		"uniform vec4 third_input;\n"
		"\n"
		"// Output\n"
		"out  vec4 out_result_from_first_routine;\n"
		"out  vec4 out_result_from_second_routine;\n"
		"out  vec4 out_result_from_third_routine;\n"
		"out uvec4 out_result_from_fourth_routine;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    out_result_from_first_routine  =       first_routine (first_input, second_input);\n"
		"    out_result_from_second_routine =       second_routine(first_input);\n"
		"    out_result_from_third_routine  =       third_routine (first_input, second_input, third_input);\n"
		"    out_result_from_fourth_routine = uvec4(fourth_routine(first_input, second_input));\n"
		"}\n"
		"\n";

	static const GLchar* subroutine_names[4][2] = {
		{ "add", "subtract" }, { "square", "square_root" }, { "do_fma", "blend" }, { "are_equal", "are_greater" }
	};

	static const GLchar* subroutine_uniform_names[4][1] = {
		{ "first_routine" }, { "second_routine" }, { "third_routine" }, { "fourth_routine" }
	};

	static const GLuint n_subroutine_types	 = sizeof(subroutine_names) / sizeof(subroutine_names[0]);
	static const GLuint n_subroutines_per_type = sizeof(subroutine_names[0]) / sizeof(subroutine_names[0][0]);
	static const GLuint n_subroutine_uniforms_per_type =
		sizeof(subroutine_uniform_names[0]) / sizeof(subroutine_uniform_names[0][0]);

	static const GLchar* uniform_names[] = { "first_input", "second_input", "third_input" };
	static const GLuint  n_uniform_names = sizeof(uniform_names) / sizeof(uniform_names[0]);

	static const GLchar* varying_names[] = { "out_result_from_first_routine", "out_result_from_second_routine",
											 "out_result_from_third_routine", "out_result_from_fourth_routine" };
	static const GLuint n_varyings					   = sizeof(varying_names) / sizeof(varying_names[0]);
	static const GLuint transform_feedback_buffer_size = n_varyings * sizeof(GLfloat) * 4 /* vec4 */;

	/* Test data */
	static const Utils::vec4<GLfloat> input_data[3] = { Utils::vec4<GLfloat>(1.0f, 4.0f, 9.0f, 16.0f),
														Utils::vec4<GLfloat>(16.0f, 9.0f, 4.0f, 1.0f),
														Utils::vec4<GLfloat>(0.25f, 0.5f, 0.75f, 1.0f) };

	static const Utils::vec4<GLfloat> expected_result_from_first_routine[2] = {
		Utils::vec4<GLfloat>(17.0f, 13.0f, 13.0f, 17.0f), Utils::vec4<GLfloat>(-15.0f, -5.0f, 5.0f, 15.0f)
	};

	static const Utils::vec4<GLfloat> expected_result_from_second_routine[2] = {
		Utils::vec4<GLfloat>(1.0f, 16.0f, 81.0f, 256.0f), Utils::vec4<GLfloat>(1.0f, 2.0f, 3.0f, 4.0f)
	};

	static const Utils::vec4<GLfloat> expected_result_from_third_routine[2] = {
		Utils::vec4<GLfloat>(16.25f, 36.5f, 36.75f, 17.0f), Utils::vec4<GLfloat>(12.25f, 6.5f, 7.75f, 16.0f)
	};

	static const Utils::vec4<GLuint> expected_result_from_fourth_routine[2] = { Utils::vec4<GLuint>(0, 0, 0, 0),
																				Utils::vec4<GLuint>(0, 0, 1, 1) };

	/* All combinations of subroutines */
	static const GLuint subroutine_combinations[][4] = {
		{ 0, 0, 0, 0 }, { 0, 0, 0, 1 }, { 0, 0, 1, 0 }, { 0, 0, 1, 1 }, { 0, 1, 0, 0 }, { 0, 1, 0, 1 },
		{ 0, 1, 1, 0 }, { 0, 1, 1, 1 }, { 1, 0, 0, 0 }, { 1, 0, 0, 1 }, { 1, 0, 1, 0 }, { 1, 0, 1, 1 },
		{ 1, 1, 0, 0 }, { 1, 1, 0, 1 }, { 1, 1, 1, 0 }, { 1, 1, 1, 1 }
	};
	static const GLuint n_subroutine_combinations =
		sizeof(subroutine_combinations) / sizeof(subroutine_combinations[0]);

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Result */
	bool result = true;

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code, varying_names,
				  n_varyings);

	program.use();

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();
	transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
									 GL_DYNAMIC_COPY);
	transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

	/* Get subroutine uniform locations and subroutine indices */
	for (GLuint type = 0; type < n_subroutine_types; ++type)
	{
		for (GLuint uniform = 0; uniform < n_subroutine_uniforms_per_type; ++uniform)
		{
			m_subroutine_uniform_locations[type][uniform] =
				program.getSubroutineUniformLocation(subroutine_uniform_names[type][uniform], GL_VERTEX_SHADER);
		}

		for (GLuint routine = 0; routine < n_subroutines_per_type; ++routine)
		{
			m_subroutine_indices[type][routine] =
				program.getSubroutineIndex(subroutine_names[type][routine], GL_VERTEX_SHADER);
		}
	}

	/* Get uniform locations */
	for (GLuint i = 0; i < n_uniform_names; ++i)
	{
		m_uniform_locations[i] = program.getUniformLocation(uniform_names[i]);
	}

	/* Draw with each routine combination */
	for (GLuint i = 0; i < n_subroutine_combinations; ++i)
	{
		Utils::vec4<GLfloat> first_routine_result;
		Utils::vec4<GLfloat> second_routine_result;
		Utils::vec4<GLfloat> third_routine_result;
		Utils::vec4<GLuint>  fourth_routine_result;

		testDraw(subroutine_combinations[i], input_data, first_routine_result, second_routine_result,
				 third_routine_result, fourth_routine_result);

		if (false == verify(first_routine_result, second_routine_result, third_routine_result, fourth_routine_result,
							expected_result_from_first_routine[subroutine_combinations[i][0]],
							expected_result_from_second_routine[subroutine_combinations[i][1]],
							expected_result_from_third_routine[subroutine_combinations[i][2]],
							expected_result_from_fourth_routine[subroutine_combinations[i][3]]))
		{
			logError(subroutine_names, subroutine_combinations[i], input_data, first_routine_result,
					 second_routine_result, third_routine_result, fourth_routine_result,
					 expected_result_from_first_routine[subroutine_combinations[i][0]],
					 expected_result_from_second_routine[subroutine_combinations[i][1]],
					 expected_result_from_third_routine[subroutine_combinations[i][2]],
					 expected_result_from_fourth_routine[subroutine_combinations[i][3]]);

			result = false;
		}
	}

	/* Done */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return tcu::TestNode::STOP;
}